

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O3

void __thiscall
rr::anon_unknown_19::writeFragmentPackets
          (anon_unknown_19 *this,RenderState *state,RenderTarget *renderTarget,Program *program,
          FragmentPacket *fragmentPackets,int numRasterizedPackets,FaceType facetype,
          vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *fragmentOutputArray,
          float *depthValues,vector<rr::Fragment,_std::allocator<rr::Fragment>_> *fragmentBuffer)

{
  FragmentPacket *pFVar1;
  Winding WVar2;
  pointer pFVar3;
  pointer pGVar4;
  undefined3 uVar5;
  ulong uVar6;
  float *pfVar7;
  FragmentOperationState *pFVar8;
  byte bVar9;
  byte bVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  FragmentOperationState *pFVar15;
  long lVar16;
  int fragNdx;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  deUint64 fragMask_1;
  long lVar20;
  byte bVar21;
  long local_2230;
  FragmentOperationState noStencilDepthWriteState;
  FragmentProcessor fragProcessor;
  
  bVar21 = 0;
  WVar2 = (state->rasterization).winding;
  FragmentProcessor::FragmentProcessor(&fragProcessor);
  bVar9 = (byte)WVar2;
  if (0 < numRasterizedPackets) {
    uVar13 = 0;
    iVar14 = 0;
    do {
      pFVar1 = fragmentPackets + uVar13;
      uVar18 = fragmentPackets[uVar13].coverage;
      uVar17 = 0;
      do {
        uVar19 = uVar17 & 1;
        bVar10 = ((char)(uVar17 >> 1) + (char)uVar19 * '\x02') * bVar9;
        uVar6 = ~(-1L << (bVar9 & 0x3f)) << (bVar10 & 0x3f);
        if ((uVar18 & uVar6) != 0) {
          pFVar3 = (fragmentBuffer->super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar12 = (pFVar1->position).m_data[1];
          pFVar3[iVar14].pixelCoord.m_data[0] = (pFVar1->position).m_data[0] + uVar19;
          pFVar3[iVar14].pixelCoord.m_data[1] = (uVar17 >> 1) + iVar12;
          uVar18 = pFVar1->coverage;
          pFVar3[iVar14].coverage = (deUint32)((uVar6 & uVar18) >> (bVar10 & 0x3f));
          if (depthValues == (float *)0x0) {
            pfVar7 = (float *)0x0;
          }
          else {
            pfVar7 = depthValues + (int)((uVar17 & 2 | (int)uVar13 * 4 | uVar19) * WVar2);
          }
          pFVar3[iVar14].sampleDepths = pfVar7;
          iVar14 = iVar14 + 1;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != 4);
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)numRasterizedPackets);
  }
  pFVar8 = (FragmentOperationState *)(this + 0x18);
  pFVar15 = &noStencilDepthWriteState;
  for (lVar11 = 0x1e; lVar11 != 0; lVar11 = lVar11 + -1) {
    uVar5 = *(undefined3 *)&pFVar8->field_0x1;
    pFVar15->scissorTestEnabled = pFVar8->scissorTestEnabled;
    *(undefined3 *)&pFVar15->field_0x1 = uVar5;
    pFVar8 = (FragmentOperationState *)((long)pFVar8 + (ulong)bVar21 * -8 + 4);
    pFVar15 = (FragmentOperationState *)((long)pFVar15 + (ulong)bVar21 * -8 + 4);
  }
  noStencilDepthWriteState.blendColor.m_data._0_8_ = *(undefined8 *)(this + 0x90);
  noStencilDepthWriteState.blendColor.m_data._8_8_ = *(undefined8 *)(this + 0x98);
  noStencilDepthWriteState._136_8_ = *(undefined8 *)(this + 0xa0);
  noStencilDepthWriteState._144_8_ = *(undefined8 *)(this + 0xa8);
  noStencilDepthWriteState._152_8_ = *(undefined8 *)(this + 0xb0);
  noStencilDepthWriteState.depthMask = false;
  noStencilDepthWriteState.stencilStates[facetype].sFail = STENCILOP_KEEP;
  noStencilDepthWriteState.stencilStates[facetype].dpFail = STENCILOP_KEEP;
  noStencilDepthWriteState.stencilStates[facetype].dpPass = STENCILOP_KEEP;
  if ((RenderTarget *)program != renderTarget) {
    lVar20 = (long)program - (long)renderTarget >> 2;
    iVar14 = 0;
    local_2230 = 8;
    lVar11 = 0;
    do {
      pFVar8 = &noStencilDepthWriteState;
      if (lVar11 == lVar20 + -1) {
        pFVar8 = (FragmentOperationState *)(this + 0x18);
      }
      if (0 < numRasterizedPackets) {
        iVar12 = 0;
        uVar13 = 0;
        do {
          lVar16 = (long)iVar12 * lVar20 * 0x10 + local_2230;
          bVar21 = 0;
          uVar18 = 0;
          do {
            if ((fragmentPackets[uVar13].coverage &
                ~(-1L << (bVar9 & 0x3f)) << (((bVar21 & 2) + (char)(uVar18 >> 1)) * bVar9 & 0x3f))
                != 0) {
              pFVar3 = (fragmentBuffer->
                       super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pGVar4 = (fragmentOutputArray->
                       super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pFVar3[iVar14].value.v.uData[0] = *(deUint32 *)((long)pGVar4 + lVar16 + -8);
              pFVar3[iVar14].value.v.uData[1] = *(deUint32 *)((long)pGVar4 + lVar16 + -4);
              pFVar3[iVar14].value.v.uData[2] = *(deUint32 *)((long)&pGVar4->v + lVar16);
              pFVar3[iVar14].value.v.uData[3] = *(deUint32 *)((long)&pGVar4->v + lVar16 + 4);
              iVar14 = iVar14 + 1;
            }
            uVar18 = uVar18 + 1;
            bVar21 = bVar21 + 2;
            lVar16 = lVar16 + lVar20 * 0x10;
          } while (uVar18 != 4);
          uVar13 = uVar13 + 1;
          iVar12 = iVar12 + 4;
        } while (uVar13 != (uint)numRasterizedPackets);
      }
      FragmentProcessor::render
                (&fragProcessor,
                 (MultisamplePixelBufferAccess *)
                 ((long)(state->fragOps).stencilStates + (long)(int)lVar11 * 0x28 + -0x30),
                 (MultisamplePixelBufferAccess *)&(state->fragOps).polygonOffsetFactor,
                 (MultisamplePixelBufferAccess *)&(state->viewport).zf,
                 (fragmentBuffer->super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>).
                 _M_impl.super__Vector_impl_data._M_start,iVar14,facetype,pFVar8);
      lVar11 = lVar11 + 1;
      local_2230 = local_2230 + 0x10;
    } while (lVar11 != lVar20 + (ulong)(lVar20 == 0));
  }
  return;
}

Assistant:

void writeFragmentPackets (const RenderState&					state,
						   const RenderTarget&					renderTarget,
						   const Program&						program,
						   const FragmentPacket*				fragmentPackets,
						   int									numRasterizedPackets,
						   rr::FaceType							facetype,
						   const std::vector<rr::GenericVec4>&	fragmentOutputArray,
						   const float*							depthValues,
						   std::vector<Fragment>&				fragmentBuffer)
{
	const int			numSamples		= renderTarget.getNumSamples();
	const size_t		numOutputs		= program.fragmentShader->getOutputs().size();
	FragmentProcessor	fragProcessor;

	DE_ASSERT(fragmentOutputArray.size() >= (size_t)numRasterizedPackets*4*numOutputs);
	DE_ASSERT(fragmentBuffer.size()      >= (size_t)numRasterizedPackets*4);

	// Translate fragments but do not set the value yet
	{
		int	fragCount = 0;
		for (int packetNdx = 0; packetNdx < numRasterizedPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; fragNdx++)
		{
			const FragmentPacket&	packet	= fragmentPackets[packetNdx];
			const int				xo		= fragNdx%2;
			const int				yo		= fragNdx/2;

			if (getCoverageAnyFragmentSampleLive(packet.coverage, numSamples, xo, yo))
			{
				Fragment& fragment		= fragmentBuffer[fragCount++];

				fragment.pixelCoord		= packet.position + tcu::IVec2(xo, yo);
				fragment.coverage		= (deUint32)((packet.coverage & getCoverageFragmentSampleBits(numSamples, xo, yo)) >> getCoverageOffset(numSamples, xo, yo));
				fragment.sampleDepths	= (depthValues) ? (&depthValues[(packetNdx*4 + yo*2 + xo)*numSamples]) : (DE_NULL);
			}
		}
	}

	// Set per output output values
	{
		rr::FragmentOperationState noStencilDepthWriteState(state.fragOps);
		noStencilDepthWriteState.depthMask						= false;
		noStencilDepthWriteState.stencilStates[facetype].sFail	= STENCILOP_KEEP;
		noStencilDepthWriteState.stencilStates[facetype].dpFail	= STENCILOP_KEEP;
		noStencilDepthWriteState.stencilStates[facetype].dpPass	= STENCILOP_KEEP;

		int	fragCount = 0;
		for (size_t outputNdx = 0; outputNdx < numOutputs; ++outputNdx)
		{
			// Only the last output-pass has default state, other passes have stencil & depth writemask=0
			const rr::FragmentOperationState& fragOpsState = (outputNdx == numOutputs-1) ? (state.fragOps) : (noStencilDepthWriteState);

			for (int packetNdx = 0; packetNdx < numRasterizedPackets; ++packetNdx)
			for (int fragNdx = 0; fragNdx < 4; fragNdx++)
			{
				const FragmentPacket&	packet	= fragmentPackets[packetNdx];
				const int				xo		= fragNdx%2;
				const int				yo		= fragNdx/2;

				// Add only fragments that have live samples to shaded fragments queue.
				if (getCoverageAnyFragmentSampleLive(packet.coverage, numSamples, xo, yo))
				{
					Fragment& fragment		= fragmentBuffer[fragCount++];
					fragment.value			= fragmentOutputArray[(packetNdx*4 + fragNdx) * numOutputs + outputNdx];
				}
			}

			// Execute per-fragment ops and write
			fragProcessor.render(renderTarget.getColorBuffer((int)outputNdx), renderTarget.getDepthBuffer(), renderTarget.getStencilBuffer(), &fragmentBuffer[0], fragCount, facetype, fragOpsState);
		}
	}
}